

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall vkt::shaderexecutor::Functions::ACos::ACos(ACos *this)

{
  long *local_38;
  long local_30;
  long local_28 [2];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"acos","");
  (this->super_ArcTrigFunc).super_CFloatFunc1.super_FloatFunc1.
  super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .
  super_Func<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .super_FuncBase._vptr_FuncBase = (_func_int **)&PTR__CFloatFunc1_00d41458;
  (this->super_ArcTrigFunc).super_CFloatFunc1.m_name._M_dataplus._M_p =
       (pointer)&(this->super_ArcTrigFunc).super_CFloatFunc1.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_ArcTrigFunc).super_CFloatFunc1.m_name,local_38,
             local_30 + (long)local_38);
  (this->super_ArcTrigFunc).super_CFloatFunc1.m_func = deAcos;
  (this->super_ArcTrigFunc).super_CFloatFunc1.super_FloatFunc1.
  super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .
  super_Func<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .super_FuncBase._vptr_FuncBase = (_func_int **)&PTR__CFloatFunc1_00d43788;
  (this->super_ArcTrigFunc).m_precision = 4096.0;
  (this->super_ArcTrigFunc).m_domain.m_hasNaN = false;
  (this->super_ArcTrigFunc).m_domain.m_lo = -1.0;
  (this->super_ArcTrigFunc).m_domain.m_hi = 1.0;
  (this->super_ArcTrigFunc).m_codomain.m_hasNaN = false;
  (this->super_ArcTrigFunc).m_codomain.m_lo = 0.0;
  (this->super_ArcTrigFunc).m_codomain.m_hi = 3.141592653589793;
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  (this->super_ArcTrigFunc).super_CFloatFunc1.super_FloatFunc1.
  super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .
  super_Func<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .super_FuncBase._vptr_FuncBase = (_func_int **)&PTR__CFloatFunc1_00d436c8;
  return;
}

Assistant:

ACos (void) : ArcTrigFunc("acos", deAcos, 4096.0,
							  Interval(-1.0, 1.0),
							  Interval(0.0, DE_PI_DOUBLE)) {}